

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O0

void supsmu(double *x,int N,double *y,double *w,int periodic,double span,double alpha,double *oup)

{
  int local_60;
  int local_5c;
  int i;
  int iper;
  double *weights;
  double *sc;
  double *oup_local;
  double alpha_local;
  double span_local;
  double *pdStack_28;
  int periodic_local;
  double *w_local;
  double *y_local;
  double *pdStack_10;
  int N_local;
  double *x_local;
  
  sc = oup;
  oup_local = (double *)alpha;
  alpha_local = span;
  span_local._4_4_ = periodic;
  pdStack_28 = w;
  w_local = y;
  y_local._4_4_ = N;
  pdStack_10 = x;
  weights = (double *)calloc((long)(N * 7),8);
  if ((span_local._4_4_ != 1) && (span_local._4_4_ != 2)) {
    printf("periodic only takes two values - 1 or 2 \n");
    printf(" 1 : x is ordered interval variable \n");
    printf("2 : x is a periodic variable with values in the range (0.0,1.0) and period 1.0.\n");
    exit(-1);
  }
  local_5c = span_local._4_4_;
  if ((0.0 <= alpha_local) && (alpha_local <= 1.0)) {
    if (pdStack_28 == (double *)0x0) {
      _i = (double *)calloc((long)y_local._4_4_,8);
      for (local_60 = 0; local_60 < y_local._4_4_; local_60 = local_60 + 1) {
        _i[local_60] = 1.0;
      }
      supsmu_((int *)((long)&y_local + 4),pdStack_10,w_local,_i,&local_5c,&alpha_local,
              (double *)&oup_local,sc,weights);
      free(_i);
    }
    else {
      supsmu_((int *)((long)&y_local + 4),pdStack_10,w_local,pdStack_28,&local_5c,&alpha_local,
              (double *)&oup_local,sc,weights);
    }
    free(weights);
    return;
  }
  printf(
        "The fractional data span to use (0 <= span < 1).If specified, then use the given fixed span.\n"
        );
  printf("If set to zero (default) then use a variable span.\n");
  exit(-1);
}

Assistant:

void supsmu(double *x, int N, double *y,double *w, int periodic,double span, double alpha,double *oup) {
	/* input: */
	/*    N : number of observations (x,y - pairs). */
	/*    x(N) : ordered abscissa values. */
	/*    y(N) : corresponding ordinate (response) values. */
	/*    w(N) : weight for each (x,y) observation. set to NULL if all weights are equal. */
	/*    periodic : periodic variable flag. */
	/*       iper=1 => x is ordered interval variable. */
	/*       iper=2 => x is a periodic variable with values */
	/*                 in the range (0.0,1.0) and period 1.0. */
	/*    span : smoother span (fraction of observations in window). */
	/*           span=0.0 => automatic (variable) span selection. */
	/*    alpha : controles high frequency (small span) penality */
	/*            used with automatic span selection (bass tone control). */
	/*            (alpha.le.0.0 or alpha.gt.10.0 => no effect.). Set to -1.0 */
	/* output: */
	/*   oup(N) : smoothed ordinate (response) values. */
	double *sc,*weights;
	int iper,i;

	sc = (double*)calloc(N*7,sizeof(double));

	if (periodic == 1 || periodic == 2) {
		iper = periodic;
	} else {
		printf("periodic only takes two values - 1 or 2 \n");
		printf(" 1 : x is ordered interval variable \n");
		printf("2 : x is a periodic variable with values in the range (0.0,1.0) and period 1.0.\n");
		exit(-1);
	}

	if (span < 0.0 || span > 1.0) {
		printf("The fractional data span to use (0 <= span < 1).If specified, then use the given fixed span.\n");
        printf("If set to zero (default) then use a variable span.\n");
		exit(-1);
	}

	if (w == NULL) {
		weights = (double*)calloc(N,sizeof(double));
		for(i = 0; i < N;++i) {
			weights[i] = 1.0;
		}
		supsmu_(&N, x, y, weights, &iper, &span, &alpha, oup, sc);
		free(weights);
	} else {
		supsmu_(&N, x, y, w, &iper, &span, &alpha, oup, sc);
	}

	

	free(sc);
}